

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int SSE_16xN_SSE2(uint8_t *a,uint8_t *b,int num_pairs)

{
  __m128i b_00;
  __m128i b_01;
  __m128i a_00;
  __m128i a_01;
  int in_EDX;
  long in_RSI;
  __m128i sum2;
  __m128i sum1;
  __m128i b1;
  __m128i a1;
  __m128i b0;
  __m128i a0;
  int i;
  int32_t tmp [4];
  __m128i sum;
  __m128i *in_stack_fffffffffffffeb8;
  longlong in_stack_fffffffffffffec0;
  longlong in_stack_fffffffffffffec8;
  longlong in_stack_fffffffffffffed0;
  longlong lVar1;
  undefined4 local_dc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_a8;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_c8 = 0;
  uStack_c4 = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_a8 = in_RSI;
  for (local_dc = 0; local_dc < in_EDX; local_dc = local_dc + 1) {
    lVar1 = *(longlong *)(local_a8 + 0x20);
    a_00[1] = lVar1;
    a_00[0] = in_stack_fffffffffffffed0;
    b_00[1] = in_stack_fffffffffffffec8;
    b_00[0] = in_stack_fffffffffffffec0;
    SubtractAndAccumulate_SSE2(a_00,b_00,in_stack_fffffffffffffeb8);
    a_01[1] = lVar1;
    a_01[0] = in_stack_fffffffffffffed0;
    b_01[1] = in_stack_fffffffffffffec8;
    b_01[0] = in_stack_fffffffffffffec0;
    SubtractAndAccumulate_SSE2(a_01,b_01,in_stack_fffffffffffffeb8);
    local_18 = (int)in_stack_fffffffffffffec8;
    uStack_14 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    uStack_10 = (int)in_stack_fffffffffffffed0;
    uStack_c = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    local_28 = (int)in_stack_fffffffffffffeb8;
    uStack_24 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    uStack_20 = (int)in_stack_fffffffffffffec0;
    uStack_1c = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    local_c8 = local_c8 + local_18 + local_28;
    uStack_c4 = uStack_c4 + uStack_14 + uStack_24;
    uStack_c0 = uStack_c0 + uStack_10 + uStack_20;
    uStack_bc = uStack_bc + uStack_c + uStack_1c;
    local_a8 = local_a8 + 0x40;
  }
  return uStack_bc + uStack_c0 + uStack_c4 + local_c8;
}

Assistant:

static WEBP_INLINE int SSE_16xN_SSE2(const uint8_t* WEBP_RESTRICT a,
                                     const uint8_t* WEBP_RESTRICT b,
                                     int num_pairs) {
  __m128i sum = _mm_setzero_si128();
  int32_t tmp[4];
  int i;

  for (i = 0; i < num_pairs; ++i) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)&a[BPS * 0]);
    const __m128i b0 = _mm_loadu_si128((const __m128i*)&b[BPS * 0]);
    const __m128i a1 = _mm_loadu_si128((const __m128i*)&a[BPS * 1]);
    const __m128i b1 = _mm_loadu_si128((const __m128i*)&b[BPS * 1]);
    __m128i sum1, sum2;
    SubtractAndAccumulate_SSE2(a0, b0, &sum1);
    SubtractAndAccumulate_SSE2(a1, b1, &sum2);
    sum = _mm_add_epi32(sum, _mm_add_epi32(sum1, sum2));
    a += 2 * BPS;
    b += 2 * BPS;
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}